

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O1

int gost_mgm128_encrypt(mgm128_context *ctx,uchar *in,uchar *out,size_t len)

{
  uint uVar1;
  uint uVar2;
  uint64_t uVar3;
  ulong uVar4;
  block128_f p_Var5;
  mul128_f p_Var6;
  void *pvVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  size_t counter_bytes;
  ulong uVar17;
  size_t sVar18;
  
  uVar3 = (ctx->len).u[0];
  uVar4 = (ctx->len).u[1];
  p_Var5 = ctx->block;
  p_Var6 = ctx->mul_gf;
  pvVar7 = ctx->key;
  uVar1 = ctx->blocklen;
  if (uVar4 == 0) {
    if (uVar3 == 0) {
      (ctx->nonce).c[0] = (ctx->nonce).c[0] | 0x80;
      (*p_Var5)((uchar *)ctx,(uchar *)&ctx->Zi,pvVar7);
    }
    (ctx->nonce).c[0] = (ctx->nonce).c[0] & 0x7f;
    (*p_Var5)((uchar *)ctx,(uchar *)&ctx->Yi,pvVar7);
  }
  uVar17 = uVar4 + len;
  uVar16 = 1L << ((char)uVar1 * '\x04' - 3U & 0x3f);
  if (uVar16 < uVar3 + uVar17 || (uVar16 < uVar17 || CARRY8(uVar4,len))) {
    ERR_GOST_error(0xac,0x8d,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_gost2015.c"
                   ,0x14e);
    iVar13 = -1;
  }
  else {
    (ctx->len).u[1] = uVar17;
    uVar15 = ctx->mres;
    uVar2 = ctx->ares;
    if ((ulong)uVar2 != 0) {
      memset((void *)((long)&ctx->ACi + (ulong)uVar2),0,(ulong)(uVar1 - uVar2));
      (*p_Var5)((uchar *)&ctx->Zi,(uchar *)&ctx->Hi,pvVar7);
      (*p_Var6)((uint64_t *)&ctx->mul,(uint64_t *)&ctx->Hi,(uint64_t *)&ctx->ACi);
      uVar2 = (ctx->mul).d[1];
      uVar8 = (ctx->mul).d[2];
      uVar9 = (ctx->mul).d[3];
      uVar10 = (ctx->sum).d[1];
      uVar11 = (ctx->sum).d[2];
      uVar12 = (ctx->sum).d[3];
      (ctx->sum).d[0] = (ctx->sum).d[0] ^ (ctx->mul).d[0];
      (ctx->sum).d[1] = uVar10 ^ uVar2;
      (ctx->sum).d[2] = uVar11 ^ uVar8;
      (ctx->sum).d[3] = uVar12 ^ uVar9;
      inc_counter((uchar *)(ctx->Zi).u,(long)((int)uVar1 / 2));
      ctx->ares = 0;
    }
    if (len != 0) {
      uVar15 = uVar15 % uVar1;
      counter_bytes = (size_t)((int)uVar1 / 2);
      sVar18 = 0;
      do {
        if (uVar15 == 0) {
          (*p_Var5)((uchar *)&ctx->Yi,(uchar *)&ctx->EKi,pvVar7);
          inc_counter((ctx->Yi).c + counter_bytes,counter_bytes);
        }
        bVar14 = (ctx->EKi).c[uVar15] ^ in[sVar18];
        out[sVar18] = bVar14;
        (ctx->ACi).c[uVar15] = bVar14;
        uVar15 = uVar15 + 1;
        if (uVar15 == uVar1) {
          uVar15 = 0;
        }
        if (uVar15 == 0) {
          (*p_Var5)((uchar *)&ctx->Zi,(uchar *)&ctx->Hi,pvVar7);
          (*p_Var6)((uint64_t *)&ctx->mul,(uint64_t *)&ctx->Hi,(uint64_t *)&ctx->ACi);
          uVar2 = (ctx->mul).d[1];
          uVar8 = (ctx->mul).d[2];
          uVar9 = (ctx->mul).d[3];
          uVar10 = (ctx->sum).d[1];
          uVar11 = (ctx->sum).d[2];
          uVar12 = (ctx->sum).d[3];
          (ctx->sum).d[0] = (ctx->sum).d[0] ^ (ctx->mul).d[0];
          (ctx->sum).d[1] = uVar10 ^ uVar2;
          (ctx->sum).d[2] = uVar11 ^ uVar8;
          (ctx->sum).d[3] = uVar12 ^ uVar9;
          inc_counter((uchar *)(ctx->Zi).u,counter_bytes);
        }
        sVar18 = sVar18 + 1;
      } while (len != sVar18);
    }
    ctx->mres = uVar15;
    iVar13 = 0;
  }
  return iVar13;
}

Assistant:

int gost_mgm128_encrypt(mgm128_context *ctx, const unsigned char *in,
                          unsigned char *out, size_t len)
{
    size_t i;
    unsigned int n, mres;
    uint64_t alen = ctx->len.u[0];
    uint64_t mlen = ctx->len.u[1];
    block128_f block = ctx->block;
    mul128_f mul_gf = ctx->mul_gf;
    void *key = ctx->key;
    int bl = ctx->blocklen;

    if (mlen == 0) {
        if (alen == 0) {
            ctx->nonce.c[0] |= 0x80;
            (*block) (ctx->nonce.c, ctx->Zi.c, key);    // Z_1 = E_K(1 || nonce)
        }
        ctx->nonce.c[0] &= 0x7f;
        (*block) (ctx->nonce.c, ctx->Yi.c, key);    // Y_1 = E_K(0 || nonce)
    }

    mlen += len;

    if (mlen > ((ossl_uintmax_t)(1) << (bl * 4 - 3)) ||     // < 2^(n/2)  (len stores in bytes)
        (sizeof(len) == 8 && mlen < len) ||
        (mlen + alen) > ((ossl_uintmax_t)(1) << (bl * 4 - 3))) {
            GOSTerr(GOST_F_GOST_MGM128_ENCRYPT,
                    GOST_R_DATA_TOO_LARGE);
            return -1;
        }
    ctx->len.u[1] = mlen;

    mres = ctx->mres;

    if (ctx->ares) {
        /* First call to encrypt finalizes AAD */
        memset(ctx->ACi.c + ctx->ares, 0, bl - ctx->ares);
        (*block) (ctx->Zi.c, ctx->Hi.c, key);                   // H_i = E_K(Z_i)
        mul_gf(ctx->mul.u, ctx->Hi.u, ctx->ACi.u);              // H_i (x) A_i
        grasshopper_plus128((grasshopper_w128_t*)ctx->sum.u,    // acc XOR
            (grasshopper_w128_t*)ctx->sum.u, (grasshopper_w128_t*)ctx->mul.u);
        inc_counter(ctx->Zi.c, bl / 2);                         // Z_{i+1} = incr_l(Z_i)

        ctx->ares = 0;
    }

    n = mres % bl;
    // TODO: replace with full blocks processing
    for (i = 0; i < len; ++i) {
        if (n == 0) {
            (*block) (ctx->Yi.c, ctx->EKi.c, key);          // E_K(Y_i)
            inc_counter(ctx->Yi.c + bl / 2, bl / 2);        // Y_i = incr_r(Y_{i-1})
        }
        ctx->ACi.c[n] = out[i] = in[i] ^ ctx->EKi.c[n];     // C_i = P_i (xor) E_K(Y_i)
        mres = n = (n + 1) % bl;
        if (n == 0) {
            (*block) (ctx->Zi.c, ctx->Hi.c, key);                   // H_i = E_K(Z_i)
            mul_gf(ctx->mul.u, ctx->Hi.u, ctx->ACi.u);              // H_i (x) C_i
            grasshopper_plus128((grasshopper_w128_t*)ctx->sum.u,    // acc XOR
                (grasshopper_w128_t*)ctx->sum.u, (grasshopper_w128_t*)ctx->mul.u);
            inc_counter(ctx->Zi.c, bl / 2);                         // Z_{i+1} = incr_l(Z_i)
        }
    }

    ctx->mres = mres;
    return 0;
}